

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.c
# Opt level: O0

interp_t * interp_init(char *file,logmath_t *logmath)

{
  int32 iVar1;
  interp_t *ip_00;
  interp_t *ip;
  logmath_t *logmath_local;
  char *file_local;
  
  if (file == (char *)0x0) {
    __assert_fail("file != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                  ,0x9a,"interp_t *interp_init(const char *, logmath_t *)");
  }
  ip_00 = (interp_t *)
          __ckd_calloc__(1,0x18,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
                         ,0x9c);
  ip_00->logmath = logmath;
  iVar1 = interp_read(ip_00,file);
  if (iVar1 != 1) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/interp.c"
            ,0xa0,"interp_init(%s) failed\n",file);
    exit(1);
  }
  return ip_00;
}

Assistant:

interp_t *
interp_init(const char *file, logmath_t *logmath)
{
    interp_t *ip;

    assert(file != NULL);

    ip = (interp_t *) ckd_calloc(1, sizeof(interp_t));
    ip->logmath = logmath;

    if (interp_read(ip, file) != 1)
        E_FATAL("interp_init(%s) failed\n", file);

    return ip;
}